

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

void __thiscall ftxui::anon_unknown_0::Text::~Text(Text *this)

{
  Text *this_local;
  
  ~Text(this);
  operator_delete(this,0x80);
  return;
}

Assistant:

explicit Text(std::string text) : text_(std::move(text)) {}